

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O0

bool __thiscall QProgressStyleAnimation::isUpdateNeeded(QProgressStyleAnimation *this)

{
  bool bVar1;
  int iVar2;
  QProgressStyleAnimation *in_RDI;
  int current;
  bool local_1;
  
  bVar1 = QStyleAnimation::isUpdateNeeded(&in_RDI->super_QStyleAnimation);
  if ((bVar1) && ((iVar2 = animationStep(in_RDI), in_RDI->_step == -1 || (in_RDI->_step != iVar2))))
  {
    in_RDI->_step = iVar2;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QProgressStyleAnimation::isUpdateNeeded() const
{
    if (QStyleAnimation::isUpdateNeeded()) {
        int current = animationStep();
        if (_step == -1 || _step != current)
        {
            _step = current;
            return true;
        }
    }
    return false;
}